

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64
drwav_read_pcm_frames_s16(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  drwav_uint64 dVar4;
  drwav_uint64 dVar5;
  drwav_uint64 dVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ushort uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  drwav_int16 *pdVar16;
  undefined8 *puVar17;
  drwav_int16 dVar18;
  ulong uVar19;
  float fVar20;
  double dVar21;
  undefined8 local_1038;
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) {
    dVar4 = 0;
  }
  else {
    if (pBufferOut == (drwav_int16 *)0x0) {
      dVar4 = drwav_read_pcm_frames_le(pWav,framesToRead,(void *)0x0);
      return dVar4;
    }
    dVar4 = 0;
    switch(pWav->translatedFormatTag) {
    case 1:
      if (pWav->bitsPerSample == 0x10) {
        dVar4 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
      }
      else {
        if ((pWav->bitsPerSample & 7) == 0) {
          uVar13 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
        }
        else {
          uVar13 = (uint)(pWav->fmt).blockAlign;
        }
        dVar4 = 0;
        dVar5 = 0;
        if (uVar13 != 0) {
          do {
            dVar4 = dVar5;
            if (framesToRead == 0) {
              return dVar4;
            }
            uVar7 = 0x1000 / (ulong)uVar13;
            if (framesToRead < 0x1000 / (ulong)uVar13) {
              uVar7 = framesToRead;
            }
            dVar6 = drwav_read_pcm_frames_le(pWav,uVar7,&local_1038);
            if (dVar6 != 0) {
              uVar10 = pWav->channels;
              uVar15 = dVar6 * uVar10;
              uVar7 = (ulong)uVar13 / (ulong)uVar10;
              uVar3 = (uint)uVar7;
              switch(uVar3) {
              case 1:
                if (uVar15 != 0) {
                  lVar9 = 0;
                  do {
                    pBufferOut[lVar9] = (ushort)*(byte *)((long)&local_1038 + lVar9) << 8 ^ 0x8000;
                    lVar9 = lVar9 + 1;
                  } while (uVar15 - lVar9 != 0);
                }
                break;
              case 2:
                if (uVar15 != 0) {
                  uVar7 = 0;
                  do {
                    pBufferOut[uVar7] = *(drwav_int16 *)((long)&local_1038 + uVar7 * 2);
                    uVar7 = uVar7 + 1;
                  } while ((uVar7 & 0xffffffff) <= uVar15 && uVar15 - (uVar7 & 0xffffffff) != 0);
                }
                break;
              case 3:
                if (uVar15 != 0) {
                  lVar9 = (long)&local_1038 + 2;
                  lVar11 = 0;
                  do {
                    pBufferOut[lVar11] = *(drwav_int16 *)(lVar9 + -1);
                    lVar11 = lVar11 + 1;
                    lVar9 = lVar9 + 3;
                  } while (uVar15 - lVar11 != 0);
                }
                break;
              case 4:
                if (uVar15 != 0) {
                  lVar9 = 0;
                  do {
                    pBufferOut[lVar9] = *(drwav_int16 *)((long)&local_1038 + lVar9 * 4 + 2);
                    lVar9 = lVar9 + 1;
                  } while (uVar15 - lVar9 != 0);
                }
                break;
              default:
                if (uVar3 < 9) {
                  if (uVar15 != 0) {
                    uVar14 = 0;
                    puVar17 = &local_1038;
                    pdVar16 = pBufferOut;
                    do {
                      if (uVar13 < uVar10) {
                        dVar18 = 0;
                        uVar12 = 0;
                      }
                      else {
                        uVar12 = 0;
                        uVar19 = 0;
                        iVar8 = uVar3 * -8 + 0x40;
                        do {
                          uVar19 = uVar19 | (ulong)*(byte *)((long)puVar17 + uVar12) <<
                                            ((byte)iVar8 & 0x3f);
                          iVar8 = iVar8 + 8;
                          uVar12 = uVar12 + 1;
                        } while (uVar7 != uVar12);
                        dVar18 = (drwav_int16)(uVar19 >> 0x30);
                        uVar12 = uVar7;
                      }
                      puVar17 = (undefined8 *)((long)puVar17 + uVar12);
                      *pdVar16 = dVar18;
                      pdVar16 = pdVar16 + 1;
                      uVar14 = (ulong)((int)uVar14 + 1);
                    } while (uVar14 <= uVar15 && uVar15 - uVar14 != 0);
                  }
                }
                else {
                  memset(pBufferOut,0,uVar15 * 2);
                }
              }
              pBufferOut = pBufferOut + pWav->channels * dVar6;
              framesToRead = framesToRead - dVar6;
              dVar4 = dVar4 + dVar6;
            }
            dVar5 = dVar4;
          } while (dVar6 != 0);
        }
      }
      break;
    case 2:
      dVar4 = drwav_read_pcm_frames_s16__msadpcm(pWav,framesToRead,pBufferOut);
      return dVar4;
    case 3:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar13 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar13 = (uint)(pWav->fmt).blockAlign;
      }
      dVar4 = 0;
      dVar5 = 0;
      if (uVar13 != 0) {
        do {
          dVar4 = dVar5;
          if (framesToRead == 0) {
            return dVar4;
          }
          uVar7 = 0x1000 / (ulong)uVar13;
          if (framesToRead < 0x1000 / (ulong)uVar13) {
            uVar7 = framesToRead;
          }
          dVar6 = drwav_read_pcm_frames_le(pWav,uVar7,&local_1038);
          if (dVar6 != 0) {
            lVar9 = dVar6 * pWav->channels;
            uVar3 = uVar13 / pWav->channels;
            if (uVar3 == 8) {
              if (lVar9 != 0) {
                lVar11 = 0;
                do {
                  dVar2 = (double)(&local_1038)[lVar11];
                  uVar10 = 0x8000;
                  if (-1.0 <= dVar2) {
                    dVar21 = 1.0;
                    if (dVar2 <= 1.0) {
                      dVar21 = dVar2;
                    }
                    uVar10 = (ushort)(int)((dVar21 + 1.0) * 32767.5) ^ 0x8000;
                  }
                  pBufferOut[lVar11] = uVar10;
                  lVar11 = lVar11 + 1;
                } while (lVar9 - lVar11 != 0);
              }
            }
            else if (uVar3 == 4) {
              if (lVar9 != 0) {
                lVar11 = 0;
                do {
                  fVar1 = *(float *)((long)&local_1038 + lVar11 * 4);
                  uVar10 = 0x8000;
                  if (-1.0 <= fVar1) {
                    fVar20 = 1.0;
                    if (fVar1 <= 1.0) {
                      fVar20 = fVar1;
                    }
                    uVar10 = (ushort)(int)((fVar20 + 1.0) * 32767.5) ^ 0x8000;
                  }
                  pBufferOut[lVar11] = uVar10;
                  lVar11 = lVar11 + 1;
                } while (lVar9 - lVar11 != 0);
              }
            }
            else {
              memset(pBufferOut,0,lVar9 * 2);
            }
            pBufferOut = pBufferOut + pWav->channels * dVar6;
            framesToRead = framesToRead - dVar6;
            dVar4 = dVar4 + dVar6;
          }
          dVar5 = dVar4;
        } while (dVar6 != 0);
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar13 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar13 = (uint)(pWav->fmt).blockAlign;
      }
      dVar4 = 0;
      dVar5 = 0;
      if (uVar13 != 0) {
        do {
          dVar4 = dVar5;
          if (framesToRead == 0) {
            return dVar4;
          }
          uVar7 = 0x1000 / (ulong)uVar13;
          if (framesToRead < 0x1000 / (ulong)uVar13) {
            uVar7 = framesToRead;
          }
          dVar6 = drwav_read_pcm_frames_le(pWav,uVar7,&local_1038);
          if (dVar6 != 0) {
            lVar9 = pWav->channels * dVar6;
            if (lVar9 != 0) {
              lVar11 = 0;
              do {
                pBufferOut[lVar11] = g_drwavAlawTable[*(byte *)((long)&local_1038 + lVar11)];
                lVar11 = lVar11 + 1;
              } while (lVar9 - lVar11 != 0);
            }
            pBufferOut = pBufferOut + pWav->channels * dVar6;
            framesToRead = framesToRead - dVar6;
            dVar4 = dVar4 + dVar6;
          }
          dVar5 = dVar4;
        } while (dVar6 != 0);
      }
      break;
    case 7:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar13 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar13 = (uint)(pWav->fmt).blockAlign;
      }
      dVar4 = 0;
      if (uVar13 != 0) {
        do {
          if (framesToRead == 0) {
            return dVar4;
          }
          uVar7 = 0x1000 / (ulong)uVar13;
          if (framesToRead < 0x1000 / (ulong)uVar13) {
            uVar7 = framesToRead;
          }
          dVar5 = drwav_read_pcm_frames_le(pWav,uVar7,&local_1038);
          if (dVar5 != 0) {
            lVar9 = pWav->channels * dVar5;
            if (lVar9 != 0) {
              lVar11 = 0;
              do {
                pBufferOut[lVar11] = g_drwavMulawTable[*(byte *)((long)&local_1038 + lVar11)];
                lVar11 = lVar11 + 1;
              } while (lVar9 - lVar11 != 0);
            }
            pBufferOut = pBufferOut + pWav->channels * dVar5;
            framesToRead = framesToRead - dVar5;
            dVar4 = dVar4 + dVar5;
          }
        } while (dVar5 != 0);
      }
      break;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        dVar4 = drwav_read_pcm_frames_s16__ima(pWav,framesToRead,pBufferOut);
        return dVar4;
      }
    }
  }
  return dVar4;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s16(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(drwav_int16) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int16) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_s16__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_s16__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_s16__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_s16__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_s16__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}